

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_relative_pose.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *m;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pDVar2;
  size_t i;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM2_Qb;
  timeval tVar22;
  timeval tVar23;
  timeval tic;
  timeval toc;
  size_t numberPoints;
  rotations_t fivept_kneip_rotations;
  essentials_t sevenpt_essentials;
  essentials_t fivept_nister_essentials;
  complexEssentials_t fivept_stewenius_essentials;
  bearingVectors_t bearingVectors2;
  bearingVectors_t bearingVectors1;
  translation_t position;
  vector<int,_std::allocator<int>_> camCorrespondences2;
  vector<int,_std::allocator<int>_> camCorrespondences1;
  translation_t t_perturbed;
  transformation_t nonlinear_transformation;
  rotations_t camRotations;
  translations_t camOffsets;
  vector<int,_std::allocator<int>_> indices10;
  vector<int,_std::allocator<int>_> indices5;
  CentralRelativeAdapter adapter;
  translation_t twopt_translation;
  MatrixXd gt;
  translation_t position2;
  rotation_t rotation1;
  translation_t position1;
  rotation_t rotation;
  rotation_t R_perturbed;
  transformation_t nonlinear_transformation_10;
  rotation_t eigensolver_rotation;
  essential_t eightpt_essential;
  rotation_t rotation2;
  timeval local_648;
  timeval local_638;
  unsigned_long local_628;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_620;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_600;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_5e0;
  _Vector_base<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
  local_5c0;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_5a0;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_580;
  double local_568;
  double local_560;
  double local_558;
  double local_550;
  double local_548;
  double local_540;
  double local_538;
  double local_530;
  translation_t local_528;
  _Vector_base<int,_std::allocator<int>_> local_510;
  _Vector_base<int,_std::allocator<int>_> local_4f0;
  translation_t local_4d8;
  essential_t local_4c0;
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_440;
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_420;
  _Vector_base<int,_std::allocator<int>_> local_408;
  _Vector_base<int,_std::allocator<int>_> local_3f0;
  CentralRelativeAdapter local_3d8;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_360 [32];
  void *local_340 [3];
  Vector3d local_328;
  rotation_t local_310;
  translation_t local_2c8;
  rotation_t local_2b0;
  rotation_t local_268;
  transformation_t local_220;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_1c0 [128];
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_140 [128];
  Matrix3d local_c0 [2];
  
  opengv::initializeRandomSeed();
  local_628 = 10;
  local_3d8.super_RelativeAdapterBase._t12.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&local_2c8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_3d8);
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       1.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       0.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       0.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       0.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
       1.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
       0.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
       0.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
       0.0;
  local_310.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
       1.0;
  opengv::generateRandomTranslation(&local_328,2.0);
  opengv::generateRandomRotation(local_c0,0.5);
  local_420._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_440._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_420._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_440._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_440._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  opengv::generateCentralCameraSystem((translations_t *)&local_420,(rotations_t *)&local_440);
  local_580._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_5a0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_510._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_580._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_580._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5a0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5a0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_510._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_510._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8.super_RelativeAdapterBase._vptr_RelativeAdapterBase._0_4_ = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,unsigned_long>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_340,(int *)&local_3d8,&local_628);
  opengv::generateRandom2D2DCorrespondences
            (&local_2c8,&local_310,&local_328,local_c0,(translations_t *)&local_420,
             (rotations_t *)&local_440,local_628,0.0,0.0,(bearingVectors_t *)&local_580,
             (bearingVectors_t *)&local_5a0,(vector<int,_std::allocator<int>_> *)&local_4f0,
             (vector<int,_std::allocator<int>_> *)&local_510,(MatrixXd *)local_340);
  opengv::extractRelativePose(&local_2c8,&local_328,&local_310,local_c0,&local_528,&local_2b0,true);
  opengv::printExperimentCharacteristics(&local_528,&local_2b0,0.0,0.0);
  opengv::printEssentialMatrix(&local_528,&local_2b0);
  opengv::relative_pose::CentralRelativeAdapter::CentralRelativeAdapter
            (&local_3d8,(bearingVectors_t *)&local_580,(bearingVectors_t *)&local_5a0,&local_2b0);
  poVar1 = std::operator<<((ostream *)&std::cout,"running twopt");
  std::endl<char,std::char_traits<char>>(poVar1);
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    opengv::relative_pose::twopt
              ((translation_t *)&local_4c0,&local_3d8.super_RelativeAdapterBase,true,0,1);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  poVar1 = std::operator<<((ostream *)&std::cout,"running fivept_stewenius");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar6._0_8_ = (double)tVar22.tv_sec;
  auVar6._8_8_ = in_XMM2_Qb;
  local_5c0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar14._0_8_ = (double)tVar23.tv_usec;
  auVar14._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar14,auVar6,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_530 = auVar6._0_8_ / 50.0;
  local_5c0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5c0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    opengv::relative_pose::fivept_stewenius
              ((complexEssentials_t *)&local_4c0,&local_3d8.super_RelativeAdapterBase);
    std::
    vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
                      *)&local_5c0);
    std::
    _Vector_base<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
    ::~_Vector_base((_Vector_base<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
                     *)&local_4c0);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  poVar1 = std::operator<<((ostream *)&std::cout,"running fivept_nister");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar7._0_8_ = (double)tVar22.tv_sec;
  auVar7._8_8_ = in_XMM2_Qb;
  local_5e0._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar15._0_8_ = (double)tVar23.tv_usec;
  auVar15._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar15,auVar7,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_538 = auVar6._0_8_ / 50.0;
  local_5e0._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e0._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    opengv::relative_pose::fivept_nister
              ((essentials_t *)&local_4c0,&local_3d8.super_RelativeAdapterBase);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&local_5e0);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&local_4c0);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  poVar1 = std::operator<<((ostream *)&std::cout,"running fivept_kneip");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_620._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_620._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_620._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  opengv::getNindices((vector<int,_std::allocator<int>_> *)&local_3f0,5);
  auVar8._0_8_ = (double)tVar22.tv_sec;
  auVar8._8_8_ = in_XMM2_Qb;
  auVar16._0_8_ = (double)tVar23.tv_usec;
  auVar16._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar16,auVar8,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_540 = auVar6._0_8_ / 50.0;
  lVar4 = 0x32;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    opengv::relative_pose::fivept_kneip
              ((rotations_t *)&local_4c0,&local_3d8.super_RelativeAdapterBase,
               (vector<int,_std::allocator<int>_> *)&local_3f0);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&local_620);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&local_4c0);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  poVar1 = std::operator<<((ostream *)&std::cout,"running sevenpt");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar9._0_8_ = (double)tVar22.tv_sec;
  auVar9._8_8_ = in_XMM2_Qb;
  local_600._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar17._0_8_ = (double)tVar23.tv_usec;
  auVar17._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar17,auVar9,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_548 = auVar6._0_8_ / 50.0;
  local_600._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_600._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    opengv::relative_pose::sevenpt((essentials_t *)&local_4c0,&local_3d8.super_RelativeAdapterBase);
    std::
    vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::_M_move_assign((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                      *)&local_600);
    std::
    _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ::~_Vector_base((_Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&local_4c0);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  poVar1 = std::operator<<((ostream *)&std::cout,"running eightpt");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar10._0_8_ = (double)tVar22.tv_sec;
  auVar10._8_8_ = in_XMM2_Qb;
  auVar18._0_8_ = (double)tVar23.tv_usec;
  auVar18._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar18,auVar10,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_550 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  while( true ) {
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar5) break;
    opengv::relative_pose::eightpt(&local_4c0,&local_3d8.super_RelativeAdapterBase);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  std::operator<<((ostream *)&std::cout,"setting perturbed rotation and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"running eigensolver");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getPerturbedPose(&local_528,&local_2b0,&local_4d8,&local_268,0.01);
  auVar11._0_8_ = (double)tVar22.tv_sec;
  auVar11._8_8_ = in_XMM2_Qb;
  auVar19._0_8_ = (double)tVar23.tv_usec;
  auVar19._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar19,auVar11,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_558 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  while( true ) {
    bVar5 = lVar4 == 0;
    lVar4 = lVar4 + -1;
    if (bVar5) break;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              (&local_3d8.super_RelativeAdapterBase._R12,&local_268);
    opengv::relative_pose::eigensolver(&local_4c0,&local_3d8.super_RelativeAdapterBase,false);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization");
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getPerturbedPose(&local_528,&local_2b0,&local_4d8,&local_268,0.1);
  auVar12._0_8_ = (double)tVar22.tv_sec;
  auVar12._8_8_ = in_XMM2_Qb;
  auVar20._0_8_ = (double)tVar23.tv_usec;
  auVar20._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar20,auVar12,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_560 = auVar6._0_8_ / 50.0;
  gettimeofday(&local_648,(__timezone_ptr_t)0x0);
  lVar4 = 0x32;
  while (bVar5 = lVar4 != 0, lVar4 = lVar4 + -1, bVar5) {
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
              (&local_3d8.super_RelativeAdapterBase._t12,&local_4d8);
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              (&local_3d8.super_RelativeAdapterBase._R12,&local_268);
    opengv::relative_pose::optimize_nonlinear(&local_220,&local_3d8.super_RelativeAdapterBase);
  }
  gettimeofday(&local_638,(__timezone_ptr_t)0x0);
  tVar22 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  tVar23 = timeval_minus((timeval *)&local_638,(timeval *)&local_648);
  std::operator<<((ostream *)&std::cout,"setting perturbed pose and ");
  poVar1 = std::operator<<((ostream *)&std::cout,"performing nonlinear optimization with 10 indices"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  opengv::getNindices((vector<int,_std::allocator<int>_> *)&local_408,10);
  opengv::getPerturbedPose(&local_528,&local_2b0,&local_4d8,&local_268,0.1);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Matrix<double,3,1,0,3,1>>
            (&local_3d8.super_RelativeAdapterBase._t12,&local_4d8);
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (&local_3d8.super_RelativeAdapterBase._R12,&local_268);
  opengv::relative_pose::optimize_nonlinear
            (&local_220,&local_3d8.super_RelativeAdapterBase,
             (vector<int,_std::allocator<int>_> *)&local_408);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from two-points algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,local_360);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from stewenius\' five-point algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  auVar13._0_8_ = (double)tVar22.tv_sec;
  auVar13._8_8_ = in_XMM2_Qb;
  uVar3 = 0;
  auVar21._0_8_ = (double)tVar23.tv_usec;
  auVar21._8_8_ = in_XMM2_Qb;
  auVar6 = vfmadd132sd_fma(auVar21,auVar13,ZEXT816(0x3eb0c6f7a0b5ed8d));
  local_568 = auVar6._0_8_ / 50.0;
  for (; uVar3 < (ulong)(((long)local_5c0._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_5c0._M_impl.super__Vector_impl_data._M_start) / 0x90);
      uVar3 = uVar3 + 1) {
    m = (DenseBase<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_> *)
        std::
        vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
        ::at((vector<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
              *)&local_5c0,uVar3);
    poVar1 = Eigen::operator<<((ostream *)&std::cout,m);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nisters\' five-point algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_5e0._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_5e0._M_impl.super__Vector_impl_data._M_start) / 0x48);
      uVar3 = uVar3 + 1) {
    pDVar2 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ::at((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)&local_5e0,uVar3);
    poVar1 = Eigen::operator<<((ostream *)&std::cout,pDVar2);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from kneip\'s five-point algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_620._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_620._M_impl.super__Vector_impl_data._M_start) / 0x48);
      uVar3 = uVar3 + 1) {
    pDVar2 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ::at((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)&local_620,uVar3);
    poVar1 = Eigen::operator<<((ostream *)&std::cout,pDVar2);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from seven-point algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar3 = 0;
      uVar3 < (ulong)(((long)local_600._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_600._M_impl.super__Vector_impl_data._M_start) / 0x48);
      uVar3 = uVar3 + 1) {
    pDVar2 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
             std::
             vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
             ::at((vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                   *)&local_600,uVar3);
    poVar1 = Eigen::operator<<((ostream *)&std::cout,pDVar2);
    poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"results from eight-point algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,local_140);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from eigensystem based rotation solver:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,local_1c0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"results from nonlinear algorithm:");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_4c0);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,
                  "results from nonlinear algorithm with only few correspondences:");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_> *)&local_220);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from two-points algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_530);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from stewenius\' five-point algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_538);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from nisters\' five-point algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_540);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from kneip\'s five-point algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_548);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from seven-point algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_550);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from eight-point algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_558);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from eigensystem based rotation solver: ");
  poVar1 = std::ostream::_M_insert<double>(local_560);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::operator<<((ostream *)&std::cout,"timings from nonlinear algorithm: ");
  poVar1 = std::ostream::_M_insert<double>(local_568);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_408);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_600);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_3f0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_620);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_5e0);
  std::
  _Vector_base<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<std::complex<double>,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_5c0);
  opengv::relative_pose::CentralRelativeAdapter::~CentralRelativeAdapter(&local_3d8);
  Eigen::internal::handmade_aligned_free(local_340[0]);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_510);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_4f0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_5a0);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_580);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ::~_Vector_base(&local_440);
  std::
  _Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~_Vector_base(&local_420);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  // initialize random seed
  initializeRandomSeed();

  //set experiment parameters
  double noise = 0.0;
  double outlierFraction = 0.0;
  size_t numberPoints = 10;

  //generate a random pose for viewpoint 1
  translation_t position1 = Eigen::Vector3d::Zero();
  rotation_t rotation1 = Eigen::Matrix3d::Identity();

  //generate a random pose for viewpoint 2
  translation_t position2 = generateRandomTranslation(2.0);
  rotation_t rotation2 = generateRandomRotation(0.5);

  //create a fake central camera
  translations_t camOffsets;
  rotations_t camRotations;
  generateCentralCameraSystem( camOffsets, camRotations );

  //derive correspondences based on random point-cloud
  bearingVectors_t bearingVectors1;
  bearingVectors_t bearingVectors2;
  std::vector<int> camCorrespondences1; //unused in the central case
  std::vector<int> camCorrespondences2; //unused in the central case
  Eigen::MatrixXd gt(3,numberPoints);
  generateRandom2D2DCorrespondences(
      position1, rotation1, position2, rotation2,
      camOffsets, camRotations, numberPoints, noise, outlierFraction,
      bearingVectors1, bearingVectors2,
      camCorrespondences1, camCorrespondences2, gt );

  //Extract the relative pose
  translation_t position; rotation_t rotation;
  extractRelativePose(
      position1, position2, rotation1, rotation2, position, rotation );

  //print experiment characteristics
  printExperimentCharacteristics( position, rotation, noise, outlierFraction );
  
  //compute and print the essential-matrix
  printEssentialMatrix( position, rotation );

  //create a central relative adapter
  relative_pose::CentralRelativeAdapter adapter(
      bearingVectors1,
      bearingVectors2,
      rotation);

  //timer
  struct timeval tic;
  struct timeval toc;
  size_t iterations = 50;

  //running experiments
  std::cout << "running twopt" << std::endl;
  translation_t twopt_translation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    twopt_translation = relative_pose::twopt(adapter,true);
  gettimeofday( &toc, 0 );
  double twopt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_stewenius" << std::endl;
  complexEssentials_t fivept_stewenius_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    fivept_stewenius_essentials = relative_pose::fivept_stewenius(adapter);
  gettimeofday( &toc, 0 );
  double fivept_stewenius_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_nister" << std::endl;
  essentials_t fivept_nister_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    fivept_nister_essentials = relative_pose::fivept_nister(adapter);
  gettimeofday( &toc, 0 );
  double fivept_nister_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running fivept_kneip" << std::endl;
  rotations_t fivept_kneip_rotations;
  gettimeofday( &tic, 0 );
  std::vector<int> indices5 = getNindices(5);
  for(size_t i = 0; i < iterations; i++)
    fivept_kneip_rotations = relative_pose::fivept_kneip(adapter,indices5);
  gettimeofday( &toc, 0 );
  double fivept_kneip_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running sevenpt" << std::endl;
  essentials_t sevenpt_essentials;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    sevenpt_essentials = relative_pose::sevenpt(adapter);
  gettimeofday( &toc, 0 );
  double sevenpt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "running eightpt" << std::endl;
  essential_t eightpt_essential;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
    eightpt_essential = relative_pose::eightpt(adapter);
  gettimeofday( &toc, 0 );
  double eightpt_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed rotation and ";
  std::cout << "running eigensolver" << std::endl;
  translation_t t_perturbed; rotation_t R_perturbed;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.01);
  rotation_t eigensolver_rotation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.setR12(R_perturbed);
    eigensolver_rotation = relative_pose::eigensolver(adapter);
  }
  gettimeofday( &toc, 0 );
  double eigensolver_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization" << std::endl;
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  transformation_t nonlinear_transformation;
  gettimeofday( &tic, 0 );
  for(size_t i = 0; i < iterations; i++)
  {
    adapter.sett12(t_perturbed);
    adapter.setR12(R_perturbed);
    nonlinear_transformation = relative_pose::optimize_nonlinear(adapter);
  }
  gettimeofday( &toc, 0 );
  double nonlinear_time = TIMETODOUBLE(timeval_minus(toc,tic)) / iterations;

  std::cout << "setting perturbed pose and ";
  std::cout << "performing nonlinear optimization with 10 indices" << std::endl;
  std::vector<int> indices10 = getNindices(10);
  getPerturbedPose( position, rotation, t_perturbed, R_perturbed, 0.1);
  adapter.sett12(t_perturbed);
  adapter.setR12(R_perturbed);
  transformation_t nonlinear_transformation_10 =
      relative_pose::optimize_nonlinear(adapter,indices10);

  //print results
  std::cout << "results from two-points algorithm:" << std::endl;
  std::cout << twopt_translation << std::endl << std::endl;
  std::cout << "results from stewenius' five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_stewenius_essentials.size(); i++ )
    std::cout << fivept_stewenius_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from nisters' five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_nister_essentials.size(); i++ )
    std::cout << fivept_nister_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from kneip's five-point algorithm:" << std::endl;
  for( size_t i = 0; i < fivept_kneip_rotations.size(); i++ )
    std::cout << fivept_kneip_rotations.at(i) << std::endl << std::endl;
  std::cout << "results from seven-point algorithm:" << std::endl;
  for( size_t i = 0; i < sevenpt_essentials.size(); i++ )
    std::cout << sevenpt_essentials.at(i) << std::endl << std::endl;
  std::cout << "results from eight-point algorithm:" << std::endl;
  std::cout << eightpt_essential << std::endl << std::endl;
  std::cout << "results from eigensystem based rotation solver:" << std::endl;
  std::cout << eigensolver_rotation << std::endl << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm:" << std::endl;
  std::cout << nonlinear_transformation << std::endl << std::endl;
  std::cout << "results from nonlinear algorithm with only few correspondences:";
  std::cout << std::endl;
  std::cout << nonlinear_transformation_10 << std::endl << std::endl;

  std::cout << "timings from two-points algorithm: ";
  std::cout << twopt_time << std::endl;
  std::cout << "timings from stewenius' five-point algorithm: ";
  std::cout << fivept_stewenius_time << std::endl;
  std::cout << "timings from nisters' five-point algorithm: ";
  std::cout << fivept_nister_time << std::endl;
  std::cout << "timings from kneip's five-point algorithm: ";
  std::cout << fivept_kneip_time << std::endl;
  std::cout << "timings from seven-point algorithm: ";
  std::cout << sevenpt_time << std::endl;
  std::cout << "timings from eight-point algorithm: ";
  std::cout << eightpt_time << std::endl;
  std::cout << "timings from eigensystem based rotation solver: ";
  std::cout << eigensolver_time << std::endl;
  std::cout << "timings from nonlinear algorithm: ";
  std::cout << nonlinear_time << std::endl;
}